

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

void uECC_vli_modInv(uECC_word_t *result,uECC_word_t *input,uECC_word_t *mod,wordcount_t num_words)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong *puVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uECC_word_t *uv;
  uECC_word_t u [4];
  uECC_word_t v [4];
  uECC_word_t b [4];
  uECC_word_t a [4];
  uECC_word_t local_d8 [4];
  uECC_word_t local_b8 [4];
  ulong *local_98;
  long local_90;
  ulong *local_88;
  uECC_word_t *local_80;
  ulong local_78 [4];
  ulong local_58 [5];
  
  if ('\0' < num_words) {
    uVar1 = (ulong)(byte)num_words;
    uVar3 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 | input[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    if (uVar6 != 0) {
      local_80 = result;
      if (num_words < '\x01') {
        local_d8[0] = 1;
      }
      else {
        uVar3 = (ulong)((uint)(byte)num_words * 8);
        memcpy(local_58,input,uVar3);
        memcpy(local_78,mod,uVar3);
        uVar3 = (ulong)((uint)(byte)num_words * 8);
        memset(local_d8,0,uVar3);
        local_d8[0] = 1;
        memset(local_b8,0,uVar3);
      }
      local_98 = local_78 + (byte)num_words;
      local_88 = local_58 + (byte)num_words;
      local_90 = uVar1 - 1;
      uVar3 = uVar1;
LAB_00109d90:
      uVar3 = uVar3 - 1;
      if ((char)uVar3 < '\0') goto LAB_00109db5;
      uVar7 = (ulong)(((uint)uVar3 & 0x7f) << 3);
      uVar6 = *(ulong *)((long)local_58 + uVar7);
      uVar7 = *(ulong *)((long)local_78 + uVar7);
      bVar2 = true;
      if (uVar6 <= uVar7) goto code_r0x00109db3;
      goto LAB_00109db7;
    }
    if ('\0' < num_words) {
      memset(result,0,(ulong)(byte)num_words << 3);
      return;
    }
  }
  return;
code_r0x00109db3:
  if (uVar7 <= uVar6) goto LAB_00109d90;
LAB_00109db5:
  bVar2 = false;
LAB_00109db7:
  if ((char)uVar3 < '\0') {
    if (num_words < '\x01') {
      return;
    }
    memcpy(local_80,local_d8,(ulong)((uint)(byte)num_words * 8));
    return;
  }
  if (((byte)local_58[0] & 1) == 0) {
    uv = local_d8;
    if ('\0' < num_words) {
      uVar3 = 0;
      puVar4 = local_88;
      do {
        uVar6 = puVar4[-1];
        puVar4[-1] = uVar6 >> 1 | uVar3;
        puVar4 = puVar4 + -1;
        uVar3 = uVar6 << 0x3f;
        uv = local_d8;
      } while (local_58 < puVar4);
    }
    goto LAB_0010a033;
  }
  if (((byte)local_78[0] & 1) == 0) {
    uv = local_b8;
    if (num_words < '\x01') goto LAB_0010a033;
    uVar3 = 0;
    puVar4 = local_98;
    do {
      uVar6 = puVar4[-1];
      puVar4[-1] = uVar6 >> 1 | uVar3;
      puVar4 = puVar4 + -1;
      uVar3 = uVar6 << 0x3f;
    } while (local_78 < puVar4);
  }
  else {
    if (bVar2) {
      lVar5 = local_90;
      if ('\0' < num_words) {
        uVar6 = 0;
        uVar3 = 0;
        do {
          uVar8 = local_78[uVar6] + uVar3;
          puVar4 = local_58 + uVar6;
          uVar7 = *puVar4;
          *puVar4 = *puVar4 - uVar8;
          if (uVar8 != 0) {
            uVar3 = (ulong)(uVar7 < uVar8);
          }
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
        if ('\0' < num_words) {
          uVar3 = 0;
          puVar4 = local_88;
          do {
            uVar6 = puVar4[-1];
            puVar4[-1] = uVar6 >> 1 | uVar3;
            puVar4 = puVar4 + -1;
            uVar3 = uVar6 << 0x3f;
          } while (local_58 < puVar4);
        }
      }
      do {
        if ((char)lVar5 < '\0') goto LAB_00109f0f;
        uVar6 = (ulong)(((uint)lVar5 & 0x7f) << 3);
        uVar3 = *(ulong *)((long)local_d8 + uVar6);
        uVar6 = *(ulong *)((long)local_b8 + uVar6);
        if (uVar6 < uVar3) goto LAB_00109f0f;
        lVar5 = lVar5 + -1;
      } while (uVar6 <= uVar3);
      uv = local_d8;
      if ('\0' < num_words) {
        uVar6 = 0;
        uVar3 = 0;
        do {
          uVar7 = local_d8[uVar6];
          uVar8 = uVar7 + uVar3 + mod[uVar6];
          if (uVar8 != uVar7) {
            uVar3 = (ulong)(uVar8 < uVar7);
          }
          local_d8[uVar6] = uVar8;
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
LAB_00109f0f:
        uv = local_d8;
        if ('\0' < num_words) {
          uVar6 = 0;
          uVar3 = 0;
          do {
            uVar8 = local_b8[uVar6] + uVar3;
            puVar4 = local_d8 + uVar6;
            uVar7 = *puVar4;
            *puVar4 = *puVar4 - uVar8;
            if (uVar8 != 0) {
              uVar3 = (ulong)(uVar7 < uVar8);
            }
            uVar6 = uVar6 + 1;
            uv = local_d8;
          } while (uVar1 != uVar6);
        }
      }
      goto LAB_0010a033;
    }
    lVar5 = local_90;
    if ('\0' < num_words) {
      uVar6 = 0;
      uVar3 = 0;
      do {
        uVar8 = local_58[uVar6] + uVar3;
        puVar4 = local_78 + uVar6;
        uVar7 = *puVar4;
        *puVar4 = *puVar4 - uVar8;
        if (uVar8 != 0) {
          uVar3 = (ulong)(uVar7 < uVar8);
        }
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
      if ('\0' < num_words) {
        uVar3 = 0;
        puVar4 = local_98;
        do {
          uVar6 = puVar4[-1];
          puVar4[-1] = uVar6 >> 1 | uVar3;
          puVar4 = puVar4 + -1;
          uVar3 = uVar6 << 0x3f;
        } while (local_78 < puVar4);
      }
    }
    do {
      if ((char)lVar5 < '\0') goto LAB_00109fff;
      uVar6 = (ulong)(((uint)lVar5 & 0x7f) << 3);
      uVar3 = *(ulong *)((long)local_b8 + uVar6);
      uVar6 = *(ulong *)((long)local_d8 + uVar6);
      if (uVar6 < uVar3) goto LAB_00109fff;
      lVar5 = lVar5 + -1;
    } while (uVar6 <= uVar3);
    uv = local_b8;
    if (num_words < '\x01') goto LAB_0010a033;
    uVar6 = 0;
    uVar3 = 0;
    do {
      uVar7 = local_b8[uVar6];
      uVar8 = uVar7 + uVar3 + mod[uVar6];
      if (uVar8 != uVar7) {
        uVar3 = (ulong)(uVar8 < uVar7);
      }
      local_b8[uVar6] = uVar8;
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
LAB_00109fff:
    uv = local_b8;
    if (num_words < '\x01') goto LAB_0010a033;
    uVar6 = 0;
    uVar3 = 0;
    do {
      uVar8 = local_d8[uVar6] + uVar3;
      puVar4 = local_b8 + uVar6;
      uVar7 = *puVar4;
      *puVar4 = *puVar4 - uVar8;
      if (uVar8 != 0) {
        uVar3 = (ulong)(uVar7 < uVar8);
      }
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  uv = local_b8;
LAB_0010a033:
  vli_modInv_update(uv,mod,num_words);
  uVar3 = uVar1;
  goto LAB_00109d90;
}

Assistant:

uECC_VLI_API void uECC_vli_modInv(uECC_word_t *result,
                                  const uECC_word_t *input,
                                  const uECC_word_t *mod,
                                  wordcount_t num_words) {
    uECC_word_t a[uECC_MAX_WORDS], b[uECC_MAX_WORDS], u[uECC_MAX_WORDS], v[uECC_MAX_WORDS];
    cmpresult_t cmpResult;

    if (uECC_vli_isZero(input, num_words)) {
        uECC_vli_clear(result, num_words);
        return;
    }

    uECC_vli_set(a, input, num_words);
    uECC_vli_set(b, mod, num_words);
    uECC_vli_clear(u, num_words);
    u[0] = 1;
    uECC_vli_clear(v, num_words);
    while ((cmpResult = uECC_vli_cmp_unsafe(a, b, num_words)) != 0) {
        if (EVEN(a)) {
            uECC_vli_rshift1(a, num_words);
            vli_modInv_update(u, mod, num_words);
        } else if (EVEN(b)) {
            uECC_vli_rshift1(b, num_words);
            vli_modInv_update(v, mod, num_words);
        } else if (cmpResult > 0) {
            uECC_vli_sub(a, a, b, num_words);
            uECC_vli_rshift1(a, num_words);
            if (uECC_vli_cmp_unsafe(u, v, num_words) < 0) {
                uECC_vli_add(u, u, mod, num_words);
            }
            uECC_vli_sub(u, u, v, num_words);
            vli_modInv_update(u, mod, num_words);
        } else {
            uECC_vli_sub(b, b, a, num_words);
            uECC_vli_rshift1(b, num_words);
            if (uECC_vli_cmp_unsafe(v, u, num_words) < 0) {
                uECC_vli_add(v, v, mod, num_words);
            }
            uECC_vli_sub(v, v, u, num_words);
            vli_modInv_update(v, mod, num_words);
        }
    }
    uECC_vli_set(result, u, num_words);
}